

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O0

void __thiscall
script_standard_tests::bip341_spk_test_vectors::test_method(bip341_spk_test_vectors *this)

{
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  string_view hex_str;
  string_view hex_str_00;
  initializer_list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __l;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  bool bVar1;
  string *psVar2;
  size_t in_RCX;
  long in_FS_OFFSET;
  pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>
  *scriptpos;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
  *__range2;
  UniValue *vec;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  UniValue *vectors;
  iterator __end2;
  iterator __begin2;
  function<void_(const_UniValue_&,_int)> parse_tree;
  const_iterator __end1;
  const_iterator __begin1;
  TaprootSpendData spend_data;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
  scriptposes;
  TaprootBuilder spktest;
  UniValue tests;
  char *in_stack_fffffffffffff4c8;
  UniValue *in_stack_fffffffffffff4d0;
  char *in_stack_fffffffffffff4d8;
  UniValue *in_stack_fffffffffffff4e0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff4e8;
  TaprootBuilder *in_stack_fffffffffffff4f0;
  UniValue *in_stack_fffffffffffff4f8;
  const_string *in_stack_fffffffffffff500;
  allocator<char> *in_stack_fffffffffffff508;
  allocator_type *in_stack_fffffffffffff510;
  undefined7 in_stack_fffffffffffff518;
  undefined1 in_stack_fffffffffffff51f;
  _Base_ptr *in_stack_fffffffffffff520;
  _Base_ptr *in_stack_fffffffffffff530;
  lazy_ostream *in_stack_fffffffffffff538;
  string *in_stack_fffffffffffff550;
  UniValue *in_stack_fffffffffffff558;
  undefined7 in_stack_fffffffffffff598;
  undefined1 in_stack_fffffffffffff59f;
  const_string local_820 [2];
  lazy_ostream local_800 [2];
  allocator<char> local_7da;
  allocator<char> local_7d9;
  assertion_result local_7d8 [2];
  _Base_ptr local_7a0;
  _Base_ptr local_798;
  UniValue local_790;
  allocator<char> local_71a;
  allocator<char> local_719;
  undefined1 local_718 [16];
  undefined1 local_708 [68];
  undefined1 local_6c4 [2];
  allocator<char> local_6c2;
  undefined1 local_6c1;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [70];
  allocator<char> local_66a;
  allocator<char> local_669;
  undefined1 local_668 [16];
  undefined1 local_658 [70];
  allocator<char> local_612;
  allocator<char> local_611 [17];
  undefined1 local_600 [16];
  undefined1 local_5f0 [70];
  allocator<char> local_5aa;
  allocator<char> local_5a9 [47];
  allocator<char> local_57a;
  allocator<char> local_579;
  undefined1 *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  undefined1 local_560 [32];
  UniValue *local_540;
  UniValue *local_538;
  allocator<char> local_529;
  undefined8 local_528;
  undefined8 uStack_520;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_4d0;
  UniValue local_488 [5];
  undefined1 local_2c8 [240];
  undefined1 local_1d8 [192];
  undefined1 local_118 [48];
  undefined1 local_e8 [136];
  UniValue local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff4c8);
  local_528 = 0x7270;
  uStack_520 = 0x1c25c50;
  UniValue::read(&local_60,0x7270,(void *)0x1c25c50,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
             (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  UniValue::operator[]((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4c8);
  std::allocator<char>::~allocator(&local_529);
  UniValue::getValues(in_stack_fffffffffffff4f8);
  local_538 = (UniValue *)
              std::vector<UniValue,_std::allocator<UniValue>_>::begin
                        ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffff4d0);
  local_540 = (UniValue *)
              std::vector<UniValue,_std::allocator<UniValue>_>::end
                        ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffff4d0);
  while (bVar1 = __gnu_cxx::
                 operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                           ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffff4d8,
                            (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffff4d0), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
               *)in_stack_fffffffffffff4c8);
    TaprootBuilder::TaprootBuilder((TaprootBuilder *)in_stack_fffffffffffff4e8._M_extent_value);
    std::
    map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
    ::map((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
           *)in_stack_fffffffffffff4c8);
    local_570 = local_e8;
    local_568 = local_560;
    local_578 = local_118;
    std::function<void(UniValue_const&,int)>::
    function<script_standard_tests::bip341_spk_test_vectors::test_method()::__0,void>
              ((function<void_(const_UniValue_&,_int)> *)in_stack_fffffffffffff4e8._M_extent_value,
               (anon_class_24_3_cff04d98 *)in_stack_fffffffffffff4e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
               (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    UniValue::operator[]((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
               (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    UniValue::operator[]((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
    std::function<void_(const_UniValue_&,_int)>::operator()
              ((function<void_(const_UniValue_&,_int)> *)in_stack_fffffffffffff4d0,
               (UniValue *)in_stack_fffffffffffff4c8,(int)((ulong)in_stack_fffffffffffff4d8 >> 0x20)
              );
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4c8);
    std::allocator<char>::~allocator(&local_57a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4c8);
    std::allocator<char>::~allocator(&local_579);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
               (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    UniValue::operator[]((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
               (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    UniValue::operator[]((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
    UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4d0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4e8._M_extent_value);
    hex_str._M_str = (char *)in_stack_fffffffffffff538;
    hex_str._M_len = (size_t)in_stack_fffffffffffff530;
    ParseHex<unsigned_char>(hex_str);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff4d8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff4d0);
    bytes._M_extent._M_extent_value = in_stack_fffffffffffff4e8._M_extent_value;
    bytes._M_ptr = (pointer)in_stack_fffffffffffff4e0;
    XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_fffffffffffff4c8,bytes);
    TaprootBuilder::Finalize
              (in_stack_fffffffffffff4f0,(XOnlyPubKey *)in_stack_fffffffffffff4e8._M_extent_value);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff4d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4c8);
    std::allocator<char>::~allocator(&local_5aa);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4c8);
    std::allocator<char>::~allocator(local_5a9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                 (size_t)in_stack_fffffffffffff4f8,(const_string *)in_stack_fffffffffffff4f0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4d0,(char (*) [1])in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      TaprootBuilder::GetOutput((TaprootBuilder *)in_stack_fffffffffffff4c8);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<WitnessV1Taproot,void,void,WitnessV1Taproot,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffff4d8,(WitnessV1Taproot *)in_stack_fffffffffffff4d0);
      GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff4c8);
      Span<const_unsigned_char>::Span<CScript>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffff4d8,
                 (CScript *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
      s.m_size = (size_t)in_stack_fffffffffffff558;
      s.m_data = (uchar *)in_stack_fffffffffffff550;
      HexStr_abi_cxx11_(s);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      UniValue::operator[]
                ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      UniValue::operator[]
                ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4d0 =
           (UniValue *)UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4d8 = "vec[\"expected\"][\"scriptPubKey\"].get_str()";
      in_stack_fffffffffffff4c8 = "HexStr(GetScriptForDestination(spktest.GetOutput()))";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_5f0,local_600,0x1b7,1,2,local_1d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::allocator<char>::~allocator(&local_612);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::allocator<char>::~allocator(local_611);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      CScript::~CScript((CScript *)in_stack_fffffffffffff4c8);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffff4c8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                 (size_t)in_stack_fffffffffffff4f8,(const_string *)in_stack_fffffffffffff4f0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4d0,(char (*) [1])in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      TaprootBuilder::GetOutput((TaprootBuilder *)in_stack_fffffffffffff4c8);
      std::
      variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
      ::variant<WitnessV1Taproot,void,void,WitnessV1Taproot,void>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffff4d8,(WitnessV1Taproot *)in_stack_fffffffffffff4d0);
      EncodeDestination_abi_cxx11_((CTxDestination *)in_stack_fffffffffffff4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      UniValue::operator[]
                ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      UniValue::operator[]
                ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4d0 =
           (UniValue *)UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4d0);
      in_stack_fffffffffffff4d8 = "vec[\"expected\"][\"bip350Address\"].get_str()";
      in_stack_fffffffffffff4c8 = "EncodeDestination(spktest.GetOutput())";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (local_658,local_668,0x1b8,1,2,local_2c8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::allocator<char>::~allocator(&local_66a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::allocator<char>::~allocator(&local_669);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::
      variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
      ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)in_stack_fffffffffffff4c8);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    TaprootBuilder::GetSpendData
              ((TaprootBuilder *)CONCAT17(in_stack_fffffffffffff59f,in_stack_fffffffffffff598));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                 (size_t)in_stack_fffffffffffff4f8,(const_string *)in_stack_fffffffffffff4f0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4d0,(char (*) [1])in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      UniValue::operator[]
                ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                 (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
      UniValue::operator[]
                ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
      local_6c1 = UniValue::isNull((UniValue *)in_stack_fffffffffffff4c8);
      local_6c4[0] = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff4d8 = "spend_data.merkle_root.IsNull()";
      in_stack_fffffffffffff4d0 = (UniValue *)local_6c4;
      in_stack_fffffffffffff4c8 = "vec[\"intermediary\"][\"merkleRoot\"].isNull()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_6b0,local_6c0,0x1ba,1,2,&local_6c1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::allocator<char>::~allocator((allocator<char> *)(local_6c4 + 1));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4c8);
      std::allocator<char>::~allocator(&local_6c2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffff4d8);
    if (!bVar1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                   (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                   (size_t)in_stack_fffffffffffff4f8,(const_string *)in_stack_fffffffffffff4f0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4d0,(char (*) [1])in_stack_fffffffffffff4c8
                  );
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                   (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        UniValue::operator[]
                  ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        UniValue::operator[]
                  ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
        psVar2 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4d0);
        Span<const_unsigned_char>::Span<uint256>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffff4d8,
                   (uint256 *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
        s_00.m_size = (size_t)in_stack_fffffffffffff558;
        s_00.m_data = (uchar *)in_stack_fffffffffffff550;
        HexStr_abi_cxx11_(s_00);
        in_stack_fffffffffffff4d8 = "HexStr(spend_data.merkle_root)";
        in_stack_fffffffffffff4d0 = local_488;
        in_stack_fffffffffffff4c8 = "vec[\"intermediary\"][\"merkleRoot\"].get_str()";
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_708,local_718,0x1bc,1,2,psVar2);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4c8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4c8);
        std::allocator<char>::~allocator(&local_71a);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4c8);
        std::allocator<char>::~allocator(&local_719);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffff4c8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                 (size_t)in_stack_fffffffffffff4f8,(const_string *)in_stack_fffffffffffff4f0);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff4d0,(char (*) [1])in_stack_fffffffffffff4c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                 (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
      local_790.val._M_dataplus._M_p =
           (pointer)std::
                    map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                    ::size((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                            *)in_stack_fffffffffffff4c8);
      local_790._0_8_ =
           std::
           map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
           ::size((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
                   *)in_stack_fffffffffffff4c8);
      in_stack_fffffffffffff4d8 = "scriptposes.size()";
      in_stack_fffffffffffff4d0 = &local_790;
      in_stack_fffffffffffff4c8 = "spend_data.scripts.size()";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                ((undefined1 *)((long)&local_790.val.field_2 + 8),&local_790.val._M_string_length,
                 0x1be,1,2,&local_790.val);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff4c8);
      in_stack_fffffffffffff59f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff59f);
    local_798 = (_Base_ptr)
                std::
                map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
                ::begin((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
                         *)in_stack_fffffffffffff4d0);
    local_7a0 = (_Base_ptr)
                std::
                map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
                ::end((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
                       *)in_stack_fffffffffffff4d0);
    while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffff4d8,
                                   (_Self *)in_stack_fffffffffffff4d0), ((bVar1 ^ 0xffU) & 1) != 0)
    {
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>
                   *)in_stack_fffffffffffff4c8);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                   (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                   (size_t)in_stack_fffffffffffff4f8,(const_string *)in_stack_fffffffffffff4f0);
        std::
        map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
        ::operator[]((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
                      *)in_stack_fffffffffffff4f0,
                     (key_type *)in_stack_fffffffffffff4e8._M_extent_value);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        UniValue::operator[]
                  ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                   (char *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
        UniValue::operator[]
                  ((UniValue *)in_stack_fffffffffffff4d8,(string *)in_stack_fffffffffffff4d0);
        in_stack_fffffffffffff558 =
             UniValue::operator[](in_stack_fffffffffffff4e0,(size_t)in_stack_fffffffffffff4d8);
        in_stack_fffffffffffff550 = UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4d0);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e8._M_extent_value);
        hex_str_00._M_str = (char *)in_stack_fffffffffffff538;
        hex_str_00._M_len = (size_t)in_stack_fffffffffffff530;
        ParseHex<unsigned_char>(hex_str_00);
        std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
                  ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffff4c8);
        __l._M_len = (size_type)in_stack_fffffffffffff538;
        __l._M_array = (iterator)in_stack_fffffffffffff530;
        std::
        set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)in_stack_fffffffffffff520,__l,
              (ShortestVectorFirstComparator *)
              CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
              in_stack_fffffffffffff510);
        std::operator==((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_fffffffffffff4d8,
                        (set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         *)in_stack_fffffffffffff4d0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_fffffffffffff4d8,
                   SUB81((ulong)in_stack_fffffffffffff4d0 >> 0x38,0));
        in_stack_fffffffffffff538 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                   (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
        boost::unit_test::operator<<
                  ((lazy_ostream *)in_stack_fffffffffffff4d0,
                   (basic_cstring<const_char> *)in_stack_fffffffffffff4c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff4d8,
                   (pointer)in_stack_fffffffffffff4d0,(unsigned_long)in_stack_fffffffffffff4c8);
        in_stack_fffffffffffff4c8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_7d8,local_800,local_820,0x1c0,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_fffffffffffff4c8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff4c8);
        std::
        set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffff4c8);
        std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
                  ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   in_stack_fffffffffffff4c8);
        in_stack_fffffffffffff520 = &local_4d0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          in_stack_fffffffffffff520 = in_stack_fffffffffffff520 + -3;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff4d8);
        } while ((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffff520 != &local_4d0);
        in_stack_fffffffffffff530 = in_stack_fffffffffffff520;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4c8);
        std::allocator<char>::~allocator(&local_7da);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4c8);
        std::allocator<char>::~allocator(&local_7d9);
        in_stack_fffffffffffff51f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff51f);
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>
                    *)in_stack_fffffffffffff4c8);
    }
    TaprootSpendData::~TaprootSpendData((TaprootSpendData *)in_stack_fffffffffffff4c8);
    std::function<void_(const_UniValue_&,_int)>::~function
              ((function<void_(const_UniValue_&,_int)> *)in_stack_fffffffffffff4c8);
    std::
    map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
    ::~map((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
            *)in_stack_fffffffffffff4c8);
    TaprootBuilder::~TaprootBuilder((TaprootBuilder *)in_stack_fffffffffffff4c8);
    __gnu_cxx::
    __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                *)in_stack_fffffffffffff4c8);
  }
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffff4c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bip341_spk_test_vectors)
{
    using control_set = decltype(TaprootSpendData::scripts)::mapped_type;

    UniValue tests;
    tests.read(json_tests::bip341_wallet_vectors);

    const auto& vectors = tests["scriptPubKey"];

    for (const auto& vec : vectors.getValues()) {
        TaprootBuilder spktest;
        std::map<std::pair<std::vector<unsigned char>, int>, int> scriptposes;
        std::function<void (const UniValue&, int)> parse_tree = [&](const UniValue& node, int depth) {
            if (node.isNull()) return;
            if (node.isObject()) {
                auto script = ParseHex(node["script"].get_str());
                int idx = node["id"].getInt<int>();
                int leaf_version = node["leafVersion"].getInt<int>();
                scriptposes[{script, leaf_version}] = idx;
                spktest.Add(depth, script, leaf_version);
            } else {
                parse_tree(node[0], depth + 1);
                parse_tree(node[1], depth + 1);
            }
        };
        parse_tree(vec["given"]["scriptTree"], 0);
        spktest.Finalize(XOnlyPubKey(ParseHex(vec["given"]["internalPubkey"].get_str())));
        BOOST_CHECK_EQUAL(HexStr(GetScriptForDestination(spktest.GetOutput())), vec["expected"]["scriptPubKey"].get_str());
        BOOST_CHECK_EQUAL(EncodeDestination(spktest.GetOutput()), vec["expected"]["bip350Address"].get_str());
        auto spend_data = spktest.GetSpendData();
        BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].isNull(), spend_data.merkle_root.IsNull());
        if (!spend_data.merkle_root.IsNull()) {
            BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].get_str(), HexStr(spend_data.merkle_root));
        }
        BOOST_CHECK_EQUAL(spend_data.scripts.size(), scriptposes.size());
        for (const auto& scriptpos : scriptposes) {
            BOOST_CHECK(spend_data.scripts[scriptpos.first] == control_set{ParseHex(vec["expected"]["scriptPathControlBlocks"][scriptpos.second].get_str())});
        }
    }
}